

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void * stb_file_max(char *filename,size_t *length)

{
  FILE *__stream;
  size_t sVar1;
  size_t maxlen;
  size_t len;
  char *buffer;
  FILE *f;
  size_t *length_local;
  char *filename_local;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    sVar1 = *length;
    filename_local = (char *)malloc(sVar1 + 1);
    sVar1 = fread(filename_local,1,sVar1,__stream);
    filename_local[sVar1] = '\0';
    fclose(__stream);
    *length = sVar1;
  }
  return filename_local;
}

Assistant:

void *  stb_file_max(char *filename, size_t *length)
{
   FILE *f = stb__fopen(filename, "rb");
   char *buffer;
   size_t len, maxlen;
   if (!f) return NULL;
   maxlen = *length;
   buffer = (char *) malloc(maxlen+1);
   len = fread(buffer, 1, maxlen, f);
   buffer[len] = 0;
   fclose(f);
   *length = len;
   return buffer;
}